

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

bool __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
          (clusterizer<crnlib::vec<16U,_float>_> *this,uint max_size,
          progress_callback_func_ptr pProgress_callback,void *pProgress_data,bool quick)

{
  node_vec_type *this_00;
  vector<unsigned_int> *this_01;
  vector<unsigned_int> *this_02;
  vector<unsigned_int> *this_03;
  uint *puVar1;
  float fVar2;
  uint uVar3;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar4;
  vq_node *pvVar5;
  void *p;
  uint *puVar6;
  vec<16U,_float> *pvVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  float fVar16;
  uint i_1;
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  vq_node root;
  vec<16U,_float> result;
  float local_e8 [16];
  ulong local_a8;
  float local_a0;
  vector<unsigned_int> local_98;
  undefined5 local_88;
  undefined3 uStack_83;
  undefined4 local_80;
  undefined1 local_7c;
  float afStack_70 [16];
  
  uVar3 = (this->m_training_vecs).m_size;
  if (uVar3 == 0) {
    return false;
  }
  this->m_quick = quick;
  local_98.m_p = (uint *)0x0;
  local_98.m_size = 0;
  local_98.m_capacity = 0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  local_e8[3] = 0.0;
  local_e8[4] = 0.0;
  local_e8[5] = 0.0;
  local_e8[6] = 0.0;
  local_e8[7] = 0.0;
  local_e8[8] = 0.0;
  local_e8[9] = 0.0;
  local_e8[10] = 0.0;
  local_e8[0xb] = 0.0;
  local_e8[0xc] = 0.0;
  local_e8[0xd] = 0.0;
  local_e8[0xe] = 0.0;
  local_e8[0xf] = 0.0;
  local_a8 = 0;
  local_88 = 0xffffffffff;
  uStack_83 = 0xffffff;
  local_80 = 0xffffffff;
  local_7c = 0;
  vector<unsigned_int>::reserve(&local_98,uVar3);
  if ((this->m_training_vecs).m_size == 0) {
    fVar16 = 0.0;
  }
  else {
    fVar16 = 0.0;
    lVar21 = 0;
    uVar20 = 0;
    do {
      ppVar4 = (this->m_training_vecs).m_p;
      uVar23 = ppVar4[uVar20].second;
      fVar26 = (float)uVar23;
      lVar18 = 0;
      do {
        afStack_70[lVar18] = *(float *)((long)(ppVar4->first).m_s + lVar18 * 4 + lVar21) * fVar26;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      lVar18 = 0;
      do {
        local_e8[lVar18] = afStack_70[lVar18] + local_e8[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      local_a8 = local_a8 + uVar23;
      if (local_98.m_capacity <= local_98.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_98,local_98.m_size + 1,true,4,(object_mover)0x0,false)
        ;
      }
      local_98.m_p[local_98._8_8_ & 0xffffffff] = (uint)uVar20;
      local_98.m_size = local_98.m_size + 1;
      fVar25 = ppVar4[uVar20].first.m_s[0];
      fVar25 = fVar25 * fVar25;
      lVar18 = 1;
      do {
        fVar2 = *(float *)((long)(ppVar4->first).m_s + lVar18 * 4 + lVar21);
        fVar25 = fVar25 + fVar2 * fVar2;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      fVar16 = fVar16 + fVar25 * fVar26;
      uVar20 = uVar20 + 1;
      lVar21 = lVar21 + 0x44;
    } while (uVar20 < (this->m_training_vecs).m_size);
  }
  fVar26 = local_e8[0] * local_e8[0];
  lVar21 = 1;
  do {
    fVar26 = fVar26 + local_e8[lVar21] * local_e8[lVar21];
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x10);
  local_a0 = fVar16 - fVar26 / (float)local_a8;
  lVar21 = 0;
  do {
    local_e8[lVar21] = local_e8[lVar21] * (1.0 / (float)local_a8);
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x10);
  this_00 = &this->m_nodes;
  pvVar5 = (this->m_nodes).m_p;
  if (pvVar5 != (vq_node *)0x0) {
    uVar20 = (ulong)(this->m_nodes).m_size;
    if (uVar20 != 0) {
      lVar21 = 0;
      do {
        p = *(void **)((long)(&pvVar5->m_centroid + 1) + lVar21 + 0x10);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar21 = lVar21 + 0x70;
      } while (uVar20 * 0x70 - lVar21 != 0);
    }
    crnlib_free(this_00->m_p);
    this_00->m_p = (vq_node *)0x0;
    (this->m_nodes).m_size = 0;
    (this->m_nodes).m_capacity = 0;
  }
  vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::reserve(this_00,max_size * 2 + 1);
  uVar23 = (this->m_nodes).m_size;
  if ((this->m_nodes).m_capacity <= uVar23) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this_00,uVar23 + 1,true,0x70,
               vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::object_mover,false);
  }
  uVar23 = (this->m_nodes).m_size;
  pvVar5 = (this->m_nodes).m_p;
  lVar21 = 0;
  do {
    pvVar5[uVar23].m_centroid.m_s[lVar21] = local_e8[lVar21];
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x10);
  pvVar5[uVar23].m_variance = local_a0;
  pvVar5[uVar23].m_total_weight = local_a8;
  pvVar5[uVar23].m_vectors.m_p = (uint *)0x0;
  pvVar5[uVar23].m_vectors.m_size = 0;
  pvVar5[uVar23].m_vectors.m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&pvVar5[uVar23].m_vectors,local_98.m_size,false,4,(object_mover)0x0
             ,false);
  pvVar5[uVar23].m_vectors.m_size = local_98.m_size;
  memcpy(pvVar5[uVar23].m_vectors.m_p,local_98.m_p,(local_98._8_8_ & 0xffffffff) << 2);
  pvVar5[uVar23].m_left = (int)local_88;
  pvVar5[uVar23].m_right = (int)(CONCAT35(uStack_83,local_88) >> 0x20);
  *(ulong *)((long)&pvVar5[uVar23].m_right + 1) = CONCAT17(local_7c,CONCAT43(local_80,uStack_83));
  puVar1 = &(this->m_nodes).m_size;
  *puVar1 = *puVar1 + 1;
  this_01 = &this->m_heap;
  uVar19 = max_size + 1;
  uVar23 = (this->m_heap).m_size;
  if (uVar23 != uVar19) {
    if (uVar23 <= uVar19) {
      if ((this->m_heap).m_capacity < uVar19) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_01,uVar19,uVar23 == max_size,4,(object_mover)0x0,false);
      }
      uVar23 = (this->m_heap).m_size;
      memset((this->m_heap).m_p + uVar23,0,(ulong)(uVar19 - uVar23) << 2);
    }
    (this->m_heap).m_size = uVar19;
  }
  (this->m_heap).m_p[1] = 0;
  this->m_heap_size = 1;
  this->m_split_index = 0;
  this_02 = &this->m_left_children;
  vector<unsigned_int>::reserve(this_02,(this->m_training_vecs).m_size + 1);
  this_03 = &this->m_right_children;
  vector<unsigned_int>::reserve(this_03,(this->m_training_vecs).m_size + 1);
  uVar22 = (max_size >> 1) + 200;
  uVar23 = 0xffffffff;
  uVar19 = 2;
  while( true ) {
    bVar24 = max_size <= uVar19 - 1;
    uVar17 = this->m_heap_size;
    bVar8 = uVar17 == 0 || bVar24;
    if (uVar17 == 0 || bVar24) break;
    puVar6 = (this->m_heap).m_p;
    uVar3 = puVar6[1];
    puVar6[1] = puVar6[uVar17];
    puVar1 = &this->m_heap_size;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 != 0) {
      down_heap(this,1);
    }
    split_node(this,uVar3);
    bVar24 = true;
    if ((((uVar19 & 0x3f) == 0 && pProgress_callback != (progress_callback_func_ptr)0x0) &&
        (uVar17 = uVar22 / max_size, uVar17 != uVar23)) &&
       (bVar24 = (*pProgress_callback)(uVar17,pProgress_data), bVar24)) {
      uVar23 = uVar17;
    }
    uVar19 = uVar19 + 1;
    uVar22 = uVar22 + 100;
    if (bVar24 == false) goto LAB_0013d64f;
  }
  pvVar7 = (this->m_codebook).m_p;
  if (pvVar7 != (vec<16U,_float> *)0x0) {
    crnlib_free(pvVar7);
    (this->m_codebook).m_p = (vec<16U,_float> *)0x0;
    (this->m_codebook).m_size = 0;
    (this->m_codebook).m_capacity = 0;
  }
  this->m_overall_variance = 0.0;
  if ((this->m_nodes).m_size != 0) {
    lVar21 = 0x68;
    uVar20 = 0;
    do {
      pvVar5 = this_00->m_p;
      if (*(int *)((long)(pvVar5->m_centroid).m_s + lVar21 + -8) == -1) {
        uVar23 = (this->m_codebook).m_size;
        *(uint *)((long)(pvVar5->m_centroid).m_s + lVar21) = uVar23;
        if ((this->m_codebook).m_capacity <= uVar23) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_codebook,uVar23 + 1,true,0x40,(object_mover)0x0,
                     false);
        }
        pvVar7 = (this->m_codebook).m_p;
        uVar23 = (this->m_codebook).m_size;
        uVar9 = *(undefined8 *)((long)(pvVar5->m_centroid).m_s + lVar21 + -0x68);
        uVar10 = *(undefined8 *)((long)(pvVar5->m_centroid).m_s + lVar21 + -0x60);
        uVar11 = *(undefined8 *)((long)(pvVar5->m_centroid).m_s + lVar21 + -0x58);
        uVar12 = *(undefined8 *)((long)(pvVar5->m_centroid).m_s + lVar21 + -0x50);
        uVar13 = *(undefined8 *)((long)(pvVar5->m_centroid).m_s + lVar21 + -0x48);
        uVar14 = *(undefined8 *)((long)(&pvVar5->m_centroid + -1) + lVar21);
        uVar15 = *(undefined8 *)((long)(pvVar5->m_centroid).m_s + lVar21 + -0x30);
        *(undefined8 *)(pvVar7[uVar23].m_s + 0xc) =
             *(undefined8 *)((long)(pvVar5->m_centroid).m_s + lVar21 + -0x38);
        *(undefined8 *)(pvVar7[uVar23].m_s + 0xc + 2) = uVar15;
        *(undefined8 *)(pvVar7[uVar23].m_s + 8) = uVar13;
        *(undefined8 *)(pvVar7[uVar23].m_s + 8 + 2) = uVar14;
        *(undefined8 *)(pvVar7[uVar23].m_s + 4) = uVar11;
        *(undefined8 *)(pvVar7[uVar23].m_s + 4 + 2) = uVar12;
        *(undefined8 *)pvVar7[uVar23].m_s = uVar9;
        *(undefined8 *)(pvVar7[uVar23].m_s + 2) = uVar10;
        puVar1 = &(this->m_codebook).m_size;
        *puVar1 = *puVar1 + 1;
        this->m_overall_variance =
             *(float *)((long)(pvVar5->m_centroid).m_s + lVar21 + -0x20) + this->m_overall_variance;
      }
      uVar20 = uVar20 + 1;
      lVar21 = lVar21 + 0x70;
    } while (uVar20 < (this->m_nodes).m_size);
  }
  if (this_01->m_p != (uint *)0x0) {
    crnlib_free(this_01->m_p);
    this_01->m_p = (uint *)0x0;
    (this->m_heap).m_size = 0;
    (this->m_heap).m_capacity = 0;
  }
  if (this_02->m_p != (uint *)0x0) {
    crnlib_free(this_02->m_p);
    this_02->m_p = (uint *)0x0;
    (this->m_left_children).m_size = 0;
    (this->m_left_children).m_capacity = 0;
  }
  if (this_03->m_p != (uint *)0x0) {
    crnlib_free(this_03->m_p);
    this_03->m_p = (uint *)0x0;
    (this->m_right_children).m_size = 0;
    (this->m_right_children).m_capacity = 0;
  }
LAB_0013d64f:
  if (local_98.m_p == (uint *)0x0) {
    return bVar8;
  }
  crnlib_free(local_98.m_p);
  return bVar8;
}

Assistant:

bool generate_codebook(uint max_size, progress_callback_func_ptr pProgress_callback = nullptr, void* pProgress_data = nullptr, bool quick = false)
        {
            if (m_training_vecs.empty())
            {
                return false;
            }

            m_quick = quick;

            double ttsum = 0.0f;

            vq_node root;
            root.m_vectors.reserve(m_training_vecs.size());

            for (uint i = 0; i < m_training_vecs.size(); i++)
            {
                const VectorType& v = m_training_vecs[i].first;
                const uint weight = m_training_vecs[i].second;

                root.m_centroid += (v * (float)weight);
                root.m_total_weight += weight;
                root.m_vectors.push_back(i);

                ttsum += v.dot(v) * weight;
            }

            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));

            root.m_centroid *= (1.0f / root.m_total_weight);

            m_nodes.clear();
            m_nodes.reserve(max_size * 2 + 1);

            m_nodes.push_back(root);

            m_heap.resize(max_size + 1);
            m_heap[1] = 0;
            m_heap_size = 1;

            m_split_index = 0;

            uint total_leaves = 1;

            m_left_children.reserve(m_training_vecs.size() + 1);
            m_right_children.reserve(m_training_vecs.size() + 1);

            int prev_percentage = -1;
            while ((total_leaves < max_size) && (m_heap_size))
            {
                int worst_node_index = m_heap[1];

                m_heap[1] = m_heap[m_heap_size];
                m_heap_size--;
                if (m_heap_size)
                {
                    down_heap(1);
                }

                split_node(worst_node_index);
                total_leaves++;

                if ((pProgress_callback) && ((total_leaves & 63) == 0) && (max_size))
                {
                    int cur_percentage = (total_leaves * 100U + (max_size / 2U)) / max_size;
                    if (cur_percentage != prev_percentage)
                    {
                        if (!(*pProgress_callback)(cur_percentage, pProgress_data))
                        {
                            return false;
                        }

                        prev_percentage = cur_percentage;
                    }
                }
            }

            m_codebook.clear();

            m_overall_variance = 0.0f;

            for (uint i = 0; i < m_nodes.size(); i++)
            {
                vq_node& node = m_nodes[i];
                if (node.m_left != -1)
                {
                    CRNLIB_ASSERT(node.m_right != -1);
                    continue;
                }

                CRNLIB_ASSERT((node.m_left == -1) && (node.m_right == -1));

                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);

                m_overall_variance += node.m_variance;
            }

            m_heap.clear();
            m_left_children.clear();
            m_right_children.clear();

            return true;
        }